

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O3

ion_bpp_err_t b_insert(ion_bpp_handle_t handle,void *key,ion_bpp_external_address_t rec)

{
  ushort uVar1;
  ion_bpp_node_t *piVar2;
  char cVar3;
  ion_bpp_err_t iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ion_bpp_address_t adr;
  ion_bpp_buffer_t *pbuf;
  ion_bpp_h_node_t *h;
  ion_bpp_node_t **ppiVar8;
  ion_bpp_key_t *piVar9;
  bool bVar10;
  ion_bpp_key_t *mkey;
  ion_bpp_buffer_t *cbuf;
  ion_bpp_buffer_t *tmp [4];
  ion_bpp_key_t *local_90;
  void *local_88;
  ion_bpp_buffer_t *local_80;
  ion_bpp_external_address_t local_78;
  uint local_70;
  int local_6c;
  ion_bpp_node_t **local_68;
  ion_bpp_address_t local_60;
  ion_bpp_buffer_t *local_58 [5];
  
  pbuf = (ion_bpp_buffer_t *)((long)handle + 0x20);
  ppiVar8 = (ion_bpp_node_t **)((long)handle + 0x38);
  uVar1 = **(ushort **)((long)handle + 0x38);
  local_88 = key;
  local_78 = rec;
  if (*(int *)((long)handle + 0xb8) * 3 == (uint)(uVar1 >> 1)) {
    memcpy(*(void **)((long)handle + 0x98),*(ushort **)((long)handle + 0x38),
           (long)*(int *)((long)handle + 0x10) * 3);
    **(ushort **)((long)handle + 0x98) =
         (ushort)*(undefined4 *)*(ushort **)((long)handle + 0x98) & 0xfffe |
         **(ushort **)((long)handle + 0x38) & 1;
    **(ushort **)((long)handle + 0x38) = **(ushort **)((long)handle + 0x38) & 1;
    iVar4 = scatter(handle,pbuf,(ion_bpp_key_t *)(*(long *)((long)handle + 0x38) + 0x20),0,local_58)
    ;
    if (iVar4 != bErrOk) {
      return iVar4;
    }
    uVar1 = *(ushort *)*ppiVar8;
  }
  if ((uVar1 & 1) == 0) {
    iVar7 = 0;
    iVar5 = 0;
    uVar6 = 0;
    do {
      local_70 = uVar6;
      local_6c = iVar5;
      local_68 = ppiVar8;
      iVar5 = search(handle,pbuf,local_88,local_78,&local_90,MODE_MATCH);
      piVar9 = local_90;
      if (iVar5 < 0) {
        adr = *(ion_bpp_address_t *)(local_90 + -8);
      }
      else {
        adr = *(ion_bpp_address_t *)(local_90 + (long)*(int *)((long)handle + 8) + 8);
      }
      iVar4 = readDisk(handle,adr,&local_80);
      if (iVar4 != bErrOk) {
        return iVar4;
      }
      if (*(uint *)((long)handle + 0xb8) == (uint)(*(ushort *)local_80->p >> 1)) {
        iVar4 = gather(handle,(ion_bpp_buffer_t *)*local_68,&local_90,local_58);
        if (iVar4 != bErrOk) {
          return iVar4;
        }
        iVar4 = scatter(handle,pbuf,local_90,3,local_58);
        if (iVar4 != bErrOk) {
          return iVar4;
        }
        iVar5 = search(handle,pbuf,local_88,local_78,&local_90,MODE_MATCH);
        piVar9 = local_90;
        if (-1 < iVar5) {
          iVar4 = readDisk(handle,*(ion_bpp_address_t *)
                                   (local_90 + (long)*(int *)((long)handle + 8) + 8),&local_80);
          if (iVar4 != bErrOk) {
            return iVar4;
          }
          goto LAB_0010ab8a;
        }
        iVar4 = readDisk(handle,*(ion_bpp_address_t *)(local_90 + -8),&local_80);
        if (iVar4 != bErrOk) {
          return iVar4;
        }
LAB_0010ab79:
        if (piVar9 != &(*local_68)->fkey) goto LAB_0010ab8a;
        iVar5 = local_6c;
        if (local_70 != 0) {
          iVar5 = 1;
        }
        uVar6 = (uint)(local_70 != 0);
      }
      else {
        if (iVar5 < 0) goto LAB_0010ab79;
LAB_0010ab8a:
        local_60 = pbuf->adr;
        iVar5 = 0;
        uVar6 = 1;
      }
      ppiVar8 = &local_80->p;
      iVar7 = iVar7 + 1;
      pbuf = local_80;
    } while ((undefined1  [40])((undefined1  [40])*local_80->p & (undefined1  [40])0x1) ==
             (undefined1  [40])0x0);
    bVar10 = iVar5 != 0;
  }
  else {
    bVar10 = false;
    iVar7 = 0;
  }
  if (maxHeight < iVar7) {
    maxHeight = iVar7;
  }
  iVar7 = search(handle,pbuf,local_88,local_78,&local_90,MODE_MATCH);
  if (iVar7 == 1) {
    if ((*(int *)((long)handle + 0xc) == 0) &&
       (cVar3 = (**(code **)((long)handle + 0x18))
                          (local_88,local_90,*(undefined4 *)((long)handle + 8)), cVar3 == '\0')) {
      return bErrDupKeys;
    }
    local_90 = local_90 + *(int *)((long)handle + 0xbc);
  }
  else {
    if (iVar7 == 0) {
      return bErrDupKeys;
    }
    if ((((iVar7 == -1) && (*(int *)((long)handle + 0xc) == 0)) && (1 < *(ushort *)*ppiVar8)) &&
       (cVar3 = (**(code **)((long)handle + 0x18))
                          (local_88,local_90,*(undefined4 *)((long)handle + 8)), cVar3 == '\0')) {
      return bErrDupKeys;
    }
  }
  piVar9 = local_90;
  iVar5 = ((int)local_90 - (int)*ppiVar8) + -0x20;
  iVar7 = (uint)(*(ushort *)*ppiVar8 >> 1) * *(int *)((long)handle + 0xbc) - iVar5;
  if (iVar7 != 0) {
    memmove(local_90 + *(int *)((long)handle + 0xbc),local_90,(long)iVar7);
  }
  memcpy(piVar9,local_88,(long)*(int *)((long)handle + 8));
  iVar7 = *(int *)((long)handle + 8);
  *(ion_bpp_external_address_t *)(piVar9 + iVar7) = local_78;
  piVar9 = piVar9 + (long)iVar7 + 8;
  piVar9[0] = '\0';
  piVar9[1] = '\0';
  piVar9[2] = '\0';
  piVar9[3] = '\0';
  piVar9[4] = '\0';
  piVar9[5] = '\0';
  piVar9[6] = '\0';
  piVar9[7] = '\0';
  *(short *)*ppiVar8 = *(short *)*ppiVar8 + 2;
  pbuf->valid = boolean_true;
  pbuf->modified = boolean_true;
  if ((bool)(iVar5 == 0 & bVar10)) {
    iVar4 = readDisk(handle,local_60,&local_80);
    if (iVar4 != bErrOk) {
      return iVar4;
    }
    piVar2 = local_80->p;
    memcpy(&piVar2->fkey,local_88,(long)*(int *)((long)handle + 8));
    *(ion_bpp_external_address_t *)(&piVar2->fkey + *(int *)((long)handle + 8)) = local_78;
    local_80->valid = boolean_true;
    local_80->modified = boolean_true;
  }
  nKeysIns = nKeysIns + 1;
  return bErrOk;
}

Assistant:

ion_bpp_err_t
b_insert(
	ion_bpp_handle_t			handle,
	void						*key,
	ion_bpp_external_address_t	rec
) {
	int					rc;		/* return code */
	ion_bpp_key_t		*mkey;			/* match key */
	int					len;	/* length to shift */
	int					cc;		/* condition code */
	ion_bpp_buffer_t	*buf, *root;
	ion_bpp_buffer_t	*tmp[4];
	unsigned int		keyOff;
	ion_bpp_bool_t		lastGEvalid;		/* true if GE branch taken */
	ion_bpp_bool_t		lastLTvalid;		/* true if LT branch taken after GE branch */
	ion_bpp_address_t	lastGE;			/* last childGE traversed */
	unsigned int		lastGEkey;	/* last childGE key traversed */
	int					height;	/* height of tree */

	ion_bpp_h_node_t *h = handle;

	root		= &h->root;
	lastGEvalid = boolean_false;
	lastLTvalid = boolean_false;

	/* check for full root */
	if (ct(root) == 3 * h->maxCt) {
		/* gather root and scatter to 4 bufs */
		/* this increases b-tree height by 1 */
		if ((rc = gatherRoot(handle)) != 0) {
			return rc;
		}

		if ((rc = scatter(handle, root, fkey(root), 0, tmp)) != 0) {
			return rc;
		}
	}

	buf		= root;
	height	= 0;

	while (1) {
		if (leaf(buf)) {
			/* in leaf, and there' room guaranteed */

			if (height > maxHeight) {
				maxHeight = height;
			}

			/* set mkey to point to insertion point */
			switch (search(handle, buf, key, rec, &mkey, MODE_MATCH)) {
				case ION_CC_LT:	/* key < mkey */

					if (!h->dupKeys && (0 != ct(buf)) && (h->comp(key, mkey, (ion_key_size_t) (h->keySize)) == ION_CC_EQ)) {
						return bErrDupKeys;
					}

					break;

				case ION_CC_EQ:	/* key = mkey */
					return bErrDupKeys;
					break;

				case ION_CC_GT:	/* key > mkey */

					if (!h->dupKeys && (h->comp(key, mkey, (ion_key_size_t) (h->keySize)) == ION_CC_EQ)) {
						return bErrDupKeys;
					}

					mkey += ks(1);
					break;
			}

			/* shift items GE key to right */
			keyOff	= mkey - fkey(buf);
			len		= ks(ct(buf)) - keyOff;

			if (len) {
				memmove(mkey + ks(1), mkey, len);
			}

			/* insert new key */
			memcpy(key(mkey), key, h->keySize);
			rec(mkey)		= rec;
			childGE(mkey)	= 0;
			ct(buf)++;

			if ((rc = writeDisk(buf)) != 0) {
				return rc;
			}

			/* if new key is first key, then fixup lastGE key */
			if (!keyOff && lastLTvalid) {
				ion_bpp_buffer_t	*tbuf;
				ion_bpp_key_t		*tkey;

				if ((rc = readDisk(handle, lastGE, &tbuf)) != 0) {
					return rc;
				}

				/* tkey = fkey(tbuf) + lastGEkey; */
				tkey		= fkey(tbuf);
				memcpy(key(tkey), key, h->keySize);
				rec(tkey)	= rec;

				if ((rc = writeDisk(tbuf)) != 0) {
					return rc;
				}
			}

			nKeysIns++;
			break;
		}
		else {
			/* internal node, descend to child */
			ion_bpp_buffer_t *cbuf;	/* child buf */

			height++;

			/* read child */
			if ((cc = search(handle, buf, key, rec, &mkey, MODE_MATCH)) < 0) {
				if ((rc = readDisk(handle, childLT(mkey), &cbuf)) != 0) {
					return rc;
				}
			}
			else {
				if ((rc = readDisk(handle, childGE(mkey), &cbuf)) != 0) {
					return rc;
				}
			}

			/* check for room in child */
			if (ct(cbuf) == h->maxCt) {
				/* gather 3 bufs and scatter */
				if ((rc = gather(handle, buf, &mkey, tmp)) != 0) {
					return rc;
				}

				if ((rc = scatter(handle, buf, mkey, 3, tmp)) != 0) {
					return rc;
				}

				/* read child */
				if ((cc = search(handle, buf, key, rec, &mkey, MODE_MATCH)) < 0) {
					if ((rc = readDisk(handle, childLT(mkey), &cbuf)) != 0) {
						return rc;
					}
				}
				else {
					if ((rc = readDisk(handle, childGE(mkey), &cbuf)) != 0) {
						return rc;
					}
				}
			}

			if ((cc >= 0) || (mkey != fkey(buf))) {
				lastGEvalid = boolean_true;
				lastLTvalid = boolean_false;
				lastGE		= buf->adr;
				lastGEkey	= mkey - fkey(buf);

				if (cc < 0) {
					lastGEkey -= ks(1);
				}
			}
			else {
				if (lastGEvalid) {
					lastLTvalid = boolean_true;
				}
			}

			buf = cbuf;
		}
	}

	return bErrOk;
}